

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repack_script_text_translation.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Mzp *this;
  pointer *this_00;
  char *path;
  char *path_00;
  bool bVar1;
  undefined1 local_178 [8];
  string mzp_out;
  undefined1 local_120 [8];
  Mzp translated_mzp;
  undefined1 local_c8 [8];
  json translation_db;
  string translation_db_raw;
  Mzp mzp;
  undefined1 local_50 [8];
  string script_text_raw;
  char *output_mrg;
  char *input_mrg;
  char *translation_db_filename;
  char **argv_local;
  int argc_local;
  
  if (argc == 4) {
    path = argv[1];
    path_00 = argv[2];
    script_text_raw.field_2._8_8_ = argv[3];
    std::__cxx11::string::string((string *)local_50);
    bVar1 = mg::fs::read_file(path_00,(string *)local_50);
    if (bVar1) {
      this = (Mzp *)((long)&translation_db_raw.field_2 + 8);
      mg::data::Mzp::Mzp(this);
      bVar1 = mg::data::mzp_read((string *)local_50,this);
      if (bVar1) {
        std::__cxx11::string::string((string *)&translation_db.m_value.boolean);
        bVar1 = mg::fs::read_file(path,(string *)&translation_db.m_value);
        if (bVar1) {
          this_00 = &translated_mzp.entry_data.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::
          function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
          ::function((function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
                      *)this_00,(nullptr_t)0x0);
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::parse<std::__cxx11::string&>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)local_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &translation_db.m_value,(parser_callback_t *)this_00,true,false);
          std::
          function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
          ::~function((function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
                       *)&translated_mzp.entry_data.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          mg::data::Mzp::Mzp((Mzp *)((long)&mzp_out.field_2 + 8),
                             (Mzp *)((long)&translation_db_raw.field_2 + 8));
          patch_string_table((Mzp *)local_120,(json *)local_c8,(Mzp *)((long)&mzp_out.field_2 + 8));
          mg::data::Mzp::~Mzp((Mzp *)((long)&mzp_out.field_2 + 8));
          std::__cxx11::string::string((string *)local_178);
          mg::data::mzp_write((Mzp *)local_120,(string *)local_178);
          bVar1 = mg::fs::write_file((char *)script_text_raw.field_2._8_8_,(string *)local_178);
          if (bVar1) {
            argv_local._4_4_ = 0;
          }
          else {
            argv_local._4_4_ = -1;
          }
          std::__cxx11::string::~string((string *)local_178);
          mg::data::Mzp::~Mzp((Mzp *)local_120);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_c8);
        }
        else {
          fprintf(_stderr,"Failed to translation db from \'%s\'\n",path);
          argv_local._4_4_ = -1;
        }
        std::__cxx11::string::~string((string *)&translation_db.m_value.boolean);
      }
      else {
        fprintf(_stderr,"Failed to parse script data as MZP\n");
        argv_local._4_4_ = -1;
      }
      mg::data::Mzp::~Mzp((Mzp *)((long)&translation_db_raw.field_2 + 8));
    }
    else {
      fprintf(_stderr,"Failed to read script text from \'%s\'\n",path_00);
      argv_local._4_4_ = -1;
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  else {
    fprintf(_stderr,"%s translation_db.json script_in.mrg script_out.mrg\n",*argv);
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
  if (argc != 4) {
    fprintf(stderr, "%s translation_db.json script_in.mrg script_out.mrg\n",
            argv[0]);
    return -1;
  }

  // Name args
  const char *translation_db_filename = argv[1];
  const char *input_mrg = argv[2];
  const char *output_mrg = argv[3];

  // Try and load input script text
  std::string script_text_raw;
  if (!mg::fs::read_file(input_mrg, script_text_raw)) {
    fprintf(stderr, "Failed to read script text from '%s'\n", input_mrg);
    return -1;
  }

  // Attempt to parse script text as MZP archive
  mg::data::Mzp mzp;
  if (!mg::data::mzp_read(script_text_raw, mzp)) {
    fprintf(stderr, "Failed to parse script data as MZP\n");
    return -1;
  }

  // Try and load the translation DB
  std::string translation_db_raw;
  if (!mg::fs::read_file(translation_db_filename, translation_db_raw)) {
    fprintf(stderr, "Failed to translation db from '%s'\n",
            translation_db_filename);
    return -1;
  }
  nlohmann::json translation_db = nlohmann::json::parse(translation_db_raw);

  // Retranslate the script
  mg::data::Mzp translated_mzp = patch_string_table(translation_db, mzp);

  // Write out the translated archive
  std::string mzp_out;
  mg::data::mzp_write(translated_mzp, mzp_out);
  if (!mg::fs::write_file(output_mrg, mzp_out)) {
    return -1;
  }

  return 0;
}